

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O2

bool __thiscall
cmCMakePolicyCommand::HandleSetMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  cmState *this_01;
  string *psVar4;
  ostream *poVar5;
  PolicyStatus status;
  string sStack_1b8;
  ostringstream e;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    bVar2 = std::operator==(pbVar1 + 2,"OLD");
    status = OLD;
    if (!bVar2) {
      bVar3 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"NEW");
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,"SET given unrecognized policy status \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 2));
        std::operator<<(poVar5,"\"");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&sStack_1b8);
        std::__cxx11::string::~string((string *)&sStack_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        return false;
      }
      status = NEW;
    }
    bVar3 = cmMakefile::SetPolicy
                      ((this->super_cmCommand).Makefile,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,status);
    if (bVar3) {
      bVar3 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1,"CMP0001");
      if (!bVar2 || !bVar3) {
        return true;
      }
      this_01 = cmMakefile::GetState((this->super_cmCommand).Makefile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator<char> *)&sStack_1b8);
      psVar4 = cmState::GetInitializedCacheValue(this_01,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (psVar4 == (string *)0x0) {
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator<char> *)&sStack_1b8);
        cmMakefile::AddCacheDefinition
                  (this_00,(string *)&e,"2.4",
                   "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                   ,STRING,false);
        std::__cxx11::string::~string((string *)&e);
        return true;
      }
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"SET failed to set policy.",(allocator<char> *)&sStack_1b8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"SET must be given exactly 2 additional arguments.",
               (allocator<char> *)&sStack_1b8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
  }
  std::__cxx11::string::~string((string *)&e);
  return false;
}

Assistant:

bool cmCMakePolicyCommand::HandleSetMode(std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    this->SetError("SET must be given exactly 2 additional arguments.");
    return false;
  }

  cmPolicies::PolicyStatus status;
  if (args[2] == "OLD") {
    status = cmPolicies::OLD;
  } else if (args[2] == "NEW") {
    status = cmPolicies::NEW;
  } else {
    std::ostringstream e;
    e << "SET given unrecognized policy status \"" << args[2] << "\"";
    this->SetError(e.str());
    return false;
  }

  if (!this->Makefile->SetPolicy(args[1].c_str(), status)) {
    this->SetError("SET failed to set policy.");
    return false;
  }
  if (args[1] == "CMP0001" &&
      (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
    if (!(this->Makefile->GetState()->GetInitializedCacheValue(
          "CMAKE_BACKWARDS_COMPATIBILITY"))) {
      // Set it to 2.4 because that is the last version where the
      // variable had meaning.
      this->Makefile->AddCacheDefinition(
        "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
        "For backwards compatibility, what version of CMake "
        "commands and "
        "syntax should this version of CMake try to support.",
        cmStateEnums::STRING);
    }
  }
  return true;
}